

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManSetMapRefsGate(Nf_Man_t *p,int iObj,int Required,Nf_Mat_t *pM)

{
  uint *puVar1;
  Mio_Cell2_t *pMVar2;
  void *pvVar3;
  int *piVar4;
  Jf_Par_t *pJVar5;
  byte bVar6;
  uint uVar7;
  Nf_Cfg_t NVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if ((iObj < 0) || ((p->vCutSets).nSize <= iObj)) {
LAB_0077ed16:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar7 = (p->vCutSets).pArray[(uint)iObj];
  uVar12 = (int)uVar7 >> 0x10;
  if (((int)uVar12 < 0) || ((p->vPages).nSize <= (int)uVar12)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar11 = *(uint *)pM >> 0x14 & 0x3ff;
  if (uVar11 == 0) {
    __assert_fail("h > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x94,"int *Nf_CutFromHandle(int *, int)");
  }
  uVar10 = *(uint *)pM & 0xfffff;
  pMVar2 = p->pCells;
  uVar7 = uVar7 & 0xffff;
  pvVar3 = (p->vPages).pArray[uVar12];
  uVar12 = *(uint *)((long)pvVar3 + (ulong)uVar11 * 4 + (ulong)uVar7 * 4) & 0x1f;
  uVar14 = (ulong)uVar12;
  if (uVar12 != 0) {
    puVar1 = (uint *)((long)pvVar3 + (ulong)uVar11 * 4 + (ulong)uVar7 * 4);
    NVar8 = pM->Cfg;
    uVar7 = *(uint *)((long)puVar1 + (ulong)((uint)NVar8 >> 6 & 0x3c) + 4);
    if (uVar7 != 0) {
      uVar13 = 0;
      bVar6 = 4;
      do {
        if ((int)uVar7 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar7 = (uint)((((uint)NVar8 >> 1 & 0x7f) >> ((uint)uVar13 & 0x1f) & 1) != 0) + uVar7 * 2;
        if ((p->vMapRefs).nSize <= (int)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar4 = (p->vMapRefs).pArray + uVar7;
        *piVar4 = *piVar4 + 1;
        if ((p->vRequired).nSize <= (int)uVar7) goto LAB_0077ed16;
        iVar9 = Required - *(int *)((long)pMVar2->iDelays + uVar13 * 4 + (ulong)(uVar10 * 0x50));
        piVar4 = (p->vRequired).pArray;
        if (iVar9 < piVar4[uVar7]) {
          piVar4[uVar7] = iVar9;
        }
        uVar13 = uVar13 + 1;
        uVar14 = (ulong)(*puVar1 & 0x1f);
        if (uVar14 <= uVar13) break;
        NVar8 = pM->Cfg;
        uVar7 = puVar1[(ulong)(((uint)NVar8 >> 8) >> (bVar6 & 0x1f) & 0xf) + 1];
        bVar6 = bVar6 + 4;
      } while (uVar7 != 0);
    }
  }
  if ((uint)uVar14 != *(uint *)((long)pMVar2->iDelays + ((ulong)(uVar10 * 0x50) - 0x1c)) >> 0x1c) {
    __assert_fail("Nf_CutSize(pCut) == (int)pCell->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x5ce,"void Nf_ManSetMapRefsGate(Nf_Man_t *, int, int, Nf_Mat_t *)");
  }
  pJVar5 = p->pPars;
  pJVar5->MapAreaF =
       *(float *)((long)pMVar2->iDelays + ((ulong)(uVar10 * 0x50) - 0x18)) + pJVar5->MapAreaF;
  pJVar5->Edge = pJVar5->Edge + uVar14;
  pJVar5->Area = pJVar5->Area + 1;
  if (-1 < (int)*(uint *)pM) {
    *(uint *)pM = *(uint *)pM | 0x80000000;
    return;
  }
  __assert_fail("pM->fBest == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x5d4,"void Nf_ManSetMapRefsGate(Nf_Man_t *, int, int, Nf_Mat_t *)");
}

Assistant:

void Nf_ManSetMapRefsGate( Nf_Man_t * p, int iObj, int Required, Nf_Mat_t * pM )
{
    int k, iVar, fCompl;
    Mio_Cell2_t * pCell = Nf_ManCell( p, pM->Gate );
    int * pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, iObj), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        Nf_ObjMapRefInc( p, iVar, fCompl );
        Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
    }
    assert( Nf_CutSize(pCut) == (int)pCell->nFanins );
    // update global stats
    p->pPars->MapAreaF += pCell->AreaF;
    p->pPars->Edge += Nf_CutSize(pCut);
    p->pPars->Area++;
    // update status of the gate
    assert( pM->fBest == 0 );
    pM->fBest = 1;
}